

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeglobpattern.cpp
# Opt level: O3

void __thiscall
QMimeGlobPatternList::match
          (QMimeGlobPatternList *this,QMimeGlobMatchResult *result,QString *fileName,
          AddMatchFilterFunc *filterFunc)

{
  char16_t *pcVar1;
  QtPrivate *this_00;
  bool bVar2;
  qsizetype qVar3;
  undefined8 uVar4;
  QtPrivate *knownSuffixLength;
  undefined8 in_R9;
  QMimeGlobPattern *this_01;
  long lVar5;
  long in_FS_OFFSET;
  QStringView haystack;
  QStringView haystack0;
  QStringView haystack0_00;
  QStringView needle0;
  QStringView needle0_00;
  QString local_58;
  storage_type_conflict local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = (this->super_QList<QMimeGlobPattern>).d.size;
  if (lVar5 != 0) {
    this_01 = (this->super_QList<QMimeGlobPattern>).d.ptr;
    lVar5 = lVar5 << 6;
    do {
      bVar2 = QMimeGlobPattern::matchFileName(this_01,fileName);
      if (bVar2) {
        if ((filterFunc->super__Function_base)._M_manager == (_Manager_type)0x0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            uVar4 = std::__throw_bad_function_call();
            if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
              match();
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              _Unwind_Resume(uVar4);
            }
          }
          goto LAB_004a55f8;
        }
        bVar2 = (*filterFunc->_M_invoker)((_Any_data *)filterFunc,&this_01->m_mimeType);
        if (bVar2) {
          local_58.d.d = (this_01->m_pattern).d.d;
          pcVar1 = (this_01->m_pattern).d.ptr;
          this_00 = (QtPrivate *)(this_01->m_pattern).d.size;
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          haystack.m_data = (storage_type_conflict *)0xffffffffffffffff;
          haystack.m_size = (qsizetype)pcVar1;
          local_58.d.ptr = pcVar1;
          local_58.d.size = (qsizetype)this_00;
          qVar3 = QtPrivate::lastIndexOf(this_00,haystack,0x2a,L'\x01',(CaseSensitivity)in_R9);
          if (this_00 < (QtPrivate *)0x2) {
LAB_004a5537:
            knownSuffixLength = (QtPrivate *)0x0;
          }
          else {
            knownSuffixLength = (QtPrivate *)0x0;
            if (qVar3 == 0) {
              if (pcVar1[1] != L'.') goto LAB_004a5537;
              local_3a = L'?';
              in_R9 = 1;
              haystack0.m_data = pcVar1;
              haystack0.m_size = (qsizetype)this_00;
              needle0.m_data = &local_3a;
              needle0.m_size = 1;
              qVar3 = QtPrivate::findString(haystack0,0,needle0,CaseSensitive);
              knownSuffixLength = (QtPrivate *)0x0;
              if (qVar3 == -1) {
                local_3a = L'[';
                in_R9 = 1;
                haystack0_00.m_data = pcVar1;
                haystack0_00.m_size = (qsizetype)this_00;
                needle0_00.m_data = &local_3a;
                needle0_00.m_size = 1;
                qVar3 = QtPrivate::findString(haystack0_00,0,needle0_00,CaseSensitive);
                if (qVar3 != -1) goto LAB_004a5537;
                knownSuffixLength = this_00 + -2;
              }
            }
          }
          QMimeGlobMatchResult::addMatch
                    (result,&this_01->m_mimeType,this_01->m_weight,&local_58,
                     (qsizetype)knownSuffixLength);
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
      }
      this_01 = this_01 + 1;
      lVar5 = lVar5 + -0x40;
    } while (lVar5 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_004a55f8:
  __stack_chk_fail();
}

Assistant:

void QMimeGlobPatternList::match(QMimeGlobMatchResult &result, const QString &fileName,
                                 const AddMatchFilterFunc &filterFunc) const
{
    for (const QMimeGlobPattern &glob : *this) {
        if (glob.matchFileName(fileName) && filterFunc(glob.mimeType())) {
            const QString pattern = glob.pattern();
            const qsizetype suffixLen = isSimplePattern(pattern) ? pattern.size() - strlen("*.") : 0;
            result.addMatch(glob.mimeType(), glob.weight(), pattern, suffixLen);
        }
    }
}